

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdump.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *in_RSI;
  char *ALPHA2;
  char *ALPHA;
  void *in_stack_ffffffffffffffd8;
  char *output;
  zt_hexdump_output output_00;
  char *size;
  
  size = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
  output = 
  "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
  ;
  strlen("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ");
  zt_hexdump_str(in_RSI,(size_t)size,(zt_hexdump_output)output,in_stack_ffffffffffffffd8);
  output_00 = (zt_hexdump_output)output;
  strlen(output);
  zt_hexdump_str(in_RSI,(size_t)size,output_00,output);
  return 0;
}

Assistant:

int
main(int argc UNUSED, char * argv[] UNUSED) {
    char    * ALPHA = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
    char    * ALPHA2 = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";

    zt_hexdump_str(ALPHA, strlen(ALPHA), NULL, NULL);
    zt_hexdump_str(ALPHA2, strlen(ALPHA2), NULL, NULL);

#if 0
    {
        FILE    * fp;
        if ((fp = fopen(argv[0], "r")) != NULL) {
            zt_hexdump((int (*)(void*))fgetc, fp, NULL, NULL);
            fclose(fp);
        }
    }
#endif

    /* f = zt_hex_dump(ALPHA, strlen(ALPHA), 16), printf("%s\n", f), free(f); */
    /* f = zt_hex_dump(ALPHA, strlen(ALPHA), 32), printf("%s\n", f), free(f); */
    /* f = zt_hex_dump(ALPHA, strlen(ALPHA), 50), printf("%s\n", f), free(f); */
    /* f = zt_hex_dump(ALPHA, strlen(ALPHA), 64), printf("%s\n", f), free(f); */

    return 0;
}